

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS
ref_shard_add_pyr_as_tet(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes,REF_BOOL check_volume)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  uint uVar6;
  REF_DBL vol;
  REF_INT tet_nodes [27];
  REF_GLOB global [27];
  double local_180;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  long local_108 [27];
  
  lVar3 = 0;
  do {
    iVar1 = nodes[lVar3];
    lVar5 = -1;
    if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
       (lVar5 = ref_node->global[iVar1], lVar5 < 0)) {
      lVar5 = -1;
    }
    local_108[lVar3] = lVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  if ((local_108[0] < local_108[1] && local_108[0] < local_108[3]) ||
     (local_108[4] < local_108[3] && local_108[4] < local_108[1])) {
    local_178 = *nodes;
    local_174 = nodes[4];
    local_170 = nodes[1];
    local_16c = nodes[2];
    uVar2 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
    if (uVar2 != 0) {
      uVar4 = 0x26e;
      goto LAB_0014a6cc;
    }
    if (check_volume != 0) {
      uVar2 = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,&local_180);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x26f,"ref_shard_add_pyr_as_tet",(ulong)uVar2,"tet vol");
        return uVar2;
      }
      if (local_180 <= 0.0) {
        printf("tet vol %e\n");
        printf("nodes %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4]);
        printf("tet %d %d %d %d\n",(ulong)local_178,(ulong)local_174,(ulong)local_170,
               (ulong)local_16c);
      }
    }
    local_178 = *nodes;
    local_174 = nodes[3];
    local_170 = nodes[4];
    local_16c = nodes[2];
    uVar2 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
    if (uVar2 == 0) {
      uVar6 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x274
             ,"ref_shard_add_pyr_as_tet",(ulong)uVar2,"a tet");
      uVar6 = uVar2;
    }
    if (check_volume == 0 || uVar2 != 0) {
      return uVar6;
    }
    uVar2 = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,&local_180);
    if (uVar2 == 0) goto LAB_0014a8ba;
    uVar4 = 0x275;
    uVar6 = uVar2;
  }
  else {
    local_178 = *nodes;
    local_174 = nodes[3];
    local_170 = nodes[1];
    local_16c = nodes[2];
    uVar2 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
    if (uVar2 != 0) {
      uVar4 = 0x27e;
LAB_0014a6cc:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar4
             ,"ref_shard_add_pyr_as_tet",(ulong)uVar2,"a tet");
      return uVar2;
    }
    if (check_volume != 0) {
      uVar2 = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,&local_180);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x27f,"ref_shard_add_pyr_as_tet",(ulong)uVar2,"tet vol");
        return uVar2;
      }
      if (local_180 <= 0.0) {
        printf("tet vol %e\n");
        printf("nodes %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4]);
        printf("tet %d %d %d %d\n",(ulong)local_178,(ulong)local_174,(ulong)local_170,
               (ulong)local_16c);
      }
    }
    local_178 = nodes[1];
    local_174 = nodes[3];
    local_170 = nodes[4];
    local_16c = nodes[2];
    uVar2 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
    if (uVar2 == 0) {
      uVar6 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x284
             ,"ref_shard_add_pyr_as_tet",(ulong)uVar2,"a tet");
      uVar6 = uVar2;
    }
    if (check_volume == 0 || uVar2 != 0) {
      return uVar6;
    }
    uVar2 = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,&local_180);
    if (uVar2 == 0) goto LAB_0014a8ba;
    uVar4 = 0x285;
    uVar6 = uVar2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar4,
         "ref_shard_add_pyr_as_tet",(ulong)uVar6,"tet vol");
  uVar2 = uVar6;
LAB_0014a8ba:
  if (uVar2 != 0) {
    return uVar6;
  }
  if (local_180 <= 0.0) {
    printf("tet vol %e\n");
    printf("nodes %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],(ulong)(uint)nodes[2],
           (ulong)(uint)nodes[3],(ulong)(uint)nodes[4]);
    printf("tet %d %d %d %d\n",(ulong)local_178,(ulong)local_174,(ulong)local_170,(ulong)local_16c);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_pyr_as_tet(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes,
                                                   REF_BOOL check_volume) {
  REF_INT node;
  REF_GLOB global[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];
  for (node = 0; node < 5; node++)
    global[node] = ref_node_global(ref_node, nodes[node]);

  if ((global[0] < global[1] && global[0] < global[3]) ||
      (global[4] < global[1] &&
       global[4] < global[3])) { /* 0-4 diag split of quad */
                                 /* 4-1\
                                    |\| 2
                                    3-0/ */
    tet_nodes[0] = nodes[0];
    tet_nodes[1] = nodes[4];
    tet_nodes[2] = nodes[1];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
    tet_nodes[0] = nodes[0];
    tet_nodes[1] = nodes[3];
    tet_nodes[2] = nodes[4];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
  } else { /* 3-1 diag split of quad */
           /* 4-1\
              |/| 2
              3-0/ */
    tet_nodes[0] = nodes[0];
    tet_nodes[1] = nodes[3];
    tet_nodes[2] = nodes[1];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
    tet_nodes[0] = nodes[1];
    tet_nodes[1] = nodes[3];
    tet_nodes[2] = nodes[4];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
  }
  return REF_SUCCESS;
}